

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O1

RPCHelpMan * wallet::getaddressinfo(void)

{
  size_type *psVar1;
  ulong *puVar2;
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  string description_19;
  string description_20;
  string description_21;
  string description_22;
  string description_23;
  string description_24;
  string description_25;
  string description_26;
  string description_27;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_18;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_19;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_20;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_21;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_22;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_23;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_24;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_25;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_26;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_28;
  RPCArgOptions opts;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  undefined8 uVar22;
  RPCHelpMan *in_RDI;
  long lVar23;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  undefined4 in_stack_ffffffffffffe298;
  undefined4 uVar24;
  undefined4 in_stack_ffffffffffffe29c;
  undefined8 in_stack_ffffffffffffe2a8;
  undefined8 in_stack_ffffffffffffe2b0;
  undefined8 in_stack_ffffffffffffe2b8;
  code *pcVar25;
  undefined8 in_stack_ffffffffffffe2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffe2c8;
  pointer in_stack_ffffffffffffe2d8;
  pointer pRVar26;
  pointer in_stack_ffffffffffffe2e0;
  pointer pRVar27;
  pointer in_stack_ffffffffffffe2e8;
  pointer pRVar28;
  _Vector_impl_data in_stack_ffffffffffffe2f0;
  pointer in_stack_ffffffffffffe308;
  pointer pRVar29;
  pointer in_stack_ffffffffffffe310;
  pointer pRVar30;
  pointer in_stack_ffffffffffffe318;
  pointer pRVar31;
  undefined8 in_stack_ffffffffffffe320;
  pointer in_stack_ffffffffffffe328;
  pointer in_stack_ffffffffffffe330;
  pointer in_stack_ffffffffffffe338;
  undefined8 in_stack_ffffffffffffe340;
  pointer in_stack_ffffffffffffe348;
  pointer in_stack_ffffffffffffe350;
  pointer in_stack_ffffffffffffe358;
  undefined8 in_stack_ffffffffffffe360;
  pointer in_stack_ffffffffffffe368;
  pointer in_stack_ffffffffffffe370;
  pointer in_stack_ffffffffffffe378;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1c78;
  allocator_type local_1c59;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1c58;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1c40;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1c28;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1c08;
  allocator_type local_1be9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1be8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1bd0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1bb8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b98;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b78;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b58;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b38;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1b18;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1af8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1ad8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1ab8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a98;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a78;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a58;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a38;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a18;
  vector<RPCResult,_std::allocator<RPCResult>_> local_19f8;
  RPCResults local_19e0;
  allocator_type local_19c1;
  vector<RPCArg,_std::allocator<RPCArg>_> local_19c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19a8;
  string local_1988;
  string local_1968;
  string local_1948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1928;
  string local_1908;
  string local_18e8;
  string local_18c8;
  ulong *local_18a8;
  undefined8 local_18a0;
  ulong local_1898;
  undefined8 uStack_1890;
  ulong *local_1888;
  size_type local_1880;
  ulong local_1878;
  undefined8 uStack_1870;
  long *local_1868 [2];
  long local_1858 [2];
  long *local_1848 [2];
  long local_1838 [2];
  RPCResult local_1828;
  long *local_17a0 [2];
  long local_1790 [2];
  long *local_1780 [2];
  long local_1770 [2];
  long *local_1760 [2];
  long local_1750 [2];
  long *local_1740 [2];
  long local_1730 [2];
  long *local_1720 [2];
  long local_1710 [2];
  long *local_1700 [2];
  long local_16f0 [2];
  long *local_16e0 [2];
  long local_16d0 [2];
  long *local_16c0 [2];
  long local_16b0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16a0;
  size_type *local_1680;
  size_type local_1678;
  size_type local_1670;
  undefined8 uStack_1668;
  long *local_1660 [2];
  long local_1650 [2];
  long *local_1640 [2];
  long local_1630 [2];
  long *local_1620 [2];
  long local_1610 [2];
  long *local_1600 [2];
  long local_15f0 [2];
  long *local_15e0 [2];
  long local_15d0 [2];
  RPCResult local_15c0;
  long *local_1538 [2];
  long local_1528 [2];
  long *local_1518 [2];
  long local_1508 [2];
  long *local_14f8 [2];
  long local_14e8 [2];
  long *local_14d8 [2];
  long local_14c8 [2];
  long *local_14b8 [2];
  long local_14a8 [2];
  long *local_1498 [2];
  long local_1488 [2];
  long *local_1478 [2];
  long local_1468 [2];
  long *local_1458 [2];
  long local_1448 [2];
  RPCResult local_1438;
  long *local_13b0 [2];
  long local_13a0 [2];
  long *local_1390 [2];
  long local_1380 [2];
  long *local_1370 [2];
  long local_1360 [2];
  long *local_1350 [2];
  long local_1340 [2];
  long *local_1330 [2];
  long local_1320 [2];
  long *local_1310 [2];
  long local_1300 [2];
  long *local_12f0 [2];
  long local_12e0 [2];
  long *local_12d0 [2];
  long local_12c0 [2];
  long *local_12b0 [2];
  long local_12a0 [2];
  long *local_1290 [2];
  long local_1280 [2];
  long *local_1270 [2];
  long local_1260 [2];
  long *local_1250 [2];
  long local_1240 [2];
  long *local_1230 [2];
  long local_1220 [2];
  long *local_1210 [2];
  long local_1200 [2];
  long *local_11f0 [2];
  long local_11e0 [2];
  long *local_11d0 [2];
  long local_11c0 [2];
  long *local_11b0 [2];
  long local_11a0 [2];
  long *local_1190 [2];
  long local_1180 [2];
  long *local_1170 [2];
  long local_1160 [2];
  long *local_1150 [2];
  long local_1140 [2];
  long *local_1130 [2];
  long local_1120 [2];
  long *local_1110 [2];
  long local_1100 [2];
  long *local_10f0 [2];
  long local_10e0 [2];
  long *local_10d0 [2];
  long local_10c0 [2];
  long *local_10b0 [2];
  long local_10a0 [2];
  long *local_1090 [2];
  long local_1080 [2];
  long *local_1070 [2];
  long local_1060 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_1050;
  long *local_1030 [2];
  long local_1020 [2];
  pointer local_1010 [2];
  undefined1 local_1000 [152];
  RPCResult local_f68;
  RPCResult local_ee0;
  RPCResult local_e58;
  RPCResult local_dd0;
  RPCResult local_d48;
  RPCResult local_cc0;
  RPCResult local_c38;
  RPCResult local_bb0;
  RPCResult local_b28;
  RPCResult local_aa0;
  RPCResult local_a18;
  RPCResult local_990;
  RPCResult local_908;
  RPCResult local_880;
  RPCResult local_7f8;
  RPCResult local_770;
  RPCResult local_6e8;
  RPCResult local_660;
  RPCResult local_5d8;
  RPCResult local_550;
  RPCResult local_4c8;
  RPCResult local_440;
  RPCResult local_3b8;
  long *local_330 [2];
  long local_320 [2];
  long *local_310 [2];
  long local_300 [2];
  RPCResult local_2f0;
  undefined1 local_268;
  undefined1 *local_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined7 uStack_24f;
  undefined1 local_240 [32];
  long *local_220 [2];
  long local_210 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_200;
  undefined1 local_1a8;
  long *local_1a0 [2];
  long local_190 [2];
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1030[0] = (long *)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getaddressinfo","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nReturn information about the given bitcoin address.\nSome of the information will only be present if the address is in the active wallet.\n"
             ,"");
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"address","");
  local_200._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_1a8 = 0;
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,"The bitcoin address for which to get information.","");
  local_260 = &local_250;
  local_268 = 0;
  local_258 = 0;
  local_250 = 0;
  local_240._0_8_ = (pointer)0x0;
  local_240._8_2_ = 0;
  local_240._10_6_ = 0;
  local_240._16_2_ = 0;
  local_240._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe29c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe298;
  name._M_string_length = (size_type)in_RDI;
  name.field_2._M_allocated_capacity = in_stack_ffffffffffffe2a8;
  name.field_2._8_8_ = in_stack_ffffffffffffe2b0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffe2c0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffe2b8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffe2c8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffe2d8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffe2e0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffe2e8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffe2f0._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffe2f0._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffe2f0._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffe308;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffe310;
  description_28._M_string_length = in_stack_ffffffffffffe320;
  description_28._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe318;
  description_28.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe328;
  description_28.field_2._8_8_ = in_stack_ffffffffffffe330;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe340;
  opts._0_8_ = in_stack_ffffffffffffe338;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffe348;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe350;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffe358;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe360;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffe368;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe370;
  opts._64_8_ = in_stack_ffffffffffffe378;
  ::RPCArg::RPCArg(&local_180,name,(Type)local_1a0,fallback,description_28,opts);
  __l._M_len = 1;
  __l._M_array = &local_180;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_19c0,__l,&local_19c1);
  local_310[0] = local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"");
  local_330[0] = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"");
  local_1010[0] = (pointer)local_1000;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1010,"address","");
  local_1030[0] = local_1020;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1030,"The bitcoin address validated.","");
  local_1a18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe29c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe298;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffe2a8;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffe2b0;
  description._M_string_length = in_stack_ffffffffffffe2c0;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description.field_2 = in_stack_ffffffffffffe2c8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_ffffffffffffe2e0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffe2d8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_1000 + 0x10),STR,m_key_name,description,inner,SUB81(local_1010,0));
  local_1050.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_1050.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1050,"scriptPubKey","");
  local_1070[0] = local_1060;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1070,"The hex-encoded output script generated by the address.","");
  local_1a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe29c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe298;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffe2a8;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffe2b0;
  description_00._M_string_length = in_stack_ffffffffffffe2c0;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_00.field_2 = in_stack_ffffffffffffe2c8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult
            (&local_f68,STR_HEX,m_key_name_00,description_00,inner_00,SUB81(&local_1050,0));
  local_1090[0] = local_1080;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1090,"ismine","");
  local_10b0[0] = local_10a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_10b0,"If the address is yours.","");
  local_1a58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe29c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe298;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffe2a8;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffe2b0;
  description_01._M_string_length = in_stack_ffffffffffffe2c0;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_01.field_2 = in_stack_ffffffffffffe2c8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult(&local_ee0,BOOL,m_key_name_01,description_01,inner_01,SUB81(local_1090,0));
  local_10d0[0] = local_10c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10d0,"iswatchonly","");
  local_10f0[0] = local_10e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_10f0,"If the address is watchonly.","");
  local_1a78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe29c;
  m_key_name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe298;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffe2a8;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffe2b0;
  description_02._M_string_length = in_stack_ffffffffffffe2c0;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_02.field_2 = in_stack_ffffffffffffe2c8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult(&local_e58,BOOL,m_key_name_02,description_02,inner_02,SUB81(local_10d0,0));
  local_1110[0] = local_1100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1110,"solvable","");
  local_1130[0] = local_1120;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1130,
             "If we know how to spend coins sent to this address, ignoring the possible lack of private keys."
             ,"");
  local_1a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe29c;
  m_key_name_03._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffe298;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffe2a8;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffe2b0;
  description_03._M_string_length = in_stack_ffffffffffffe2c0;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_03.field_2 = in_stack_ffffffffffffe2c8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult(&local_dd0,BOOL,m_key_name_03,description_03,inner_03,SUB81(local_1110,0));
  local_1150[0] = local_1140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1150,"desc","");
  local_1170[0] = local_1160;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1170,
             "A descriptor for spending coins sent to this address (only when solvable).","");
  local_1ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar3._4_8_ = in_RDI;
  auVar3._0_4_ = in_stack_ffffffffffffe29c;
  auVar3._12_8_ = in_stack_ffffffffffffe2a8;
  auVar3._20_8_ = in_stack_ffffffffffffe2b0;
  auVar3._28_4_ = 0;
  description_04._M_string_length = in_stack_ffffffffffffe2c0;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_04.field_2 = in_stack_ffffffffffffe2c8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult
            (&local_d48,STR,(string)(auVar3 << 0x20),SUB81(local_1150,0),description_04,inner_04,
             true);
  local_1190[0] = local_1180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1190,"parent_desc","");
  local_11b0[0] = local_11a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_11b0,
             "The descriptor used to derive this address if this is a descriptor wallet","");
  local_1ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar4._4_8_ = in_RDI;
  auVar4._0_4_ = in_stack_ffffffffffffe29c;
  auVar4._12_8_ = in_stack_ffffffffffffe2a8;
  auVar4._20_8_ = in_stack_ffffffffffffe2b0;
  auVar4._28_4_ = 0;
  description_05._M_string_length = in_stack_ffffffffffffe2c0;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_05.field_2 = in_stack_ffffffffffffe2c8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult
            (&local_cc0,STR,(string)(auVar4 << 0x20),SUB81(local_1190,0),description_05,inner_05,
             true);
  local_11d0[0] = local_11c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11d0,"isscript","");
  local_11f0[0] = local_11e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11f0,"If the key is a script.","")
  ;
  local_1af8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1af8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1af8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar24 = 0;
  auVar5._4_8_ = in_RDI;
  auVar5._0_4_ = in_stack_ffffffffffffe29c;
  auVar5._12_8_ = in_stack_ffffffffffffe2a8;
  auVar5._20_8_ = in_stack_ffffffffffffe2b0;
  auVar5._28_4_ = 0;
  description_06._M_string_length = in_stack_ffffffffffffe2c0;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_06.field_2 = in_stack_ffffffffffffe2c8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult
            (&local_c38,BOOL,(string)(auVar5 << 0x20),SUB81(local_11d0,0),description_06,inner_06,
             true);
  local_1210[0] = local_1200;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1210,"ischange","");
  local_1230[0] = local_1220;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1230,"If the address was used for change output.","");
  local_1b18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe29c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar24;
  m_key_name_04._M_string_length = (size_type)in_RDI;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_ffffffffffffe2a8;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffe2b0;
  description_07._M_string_length = in_stack_ffffffffffffe2c0;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_07.field_2 = in_stack_ffffffffffffe2c8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult(&local_bb0,BOOL,m_key_name_04,description_07,inner_07,SUB81(local_1210,0));
  local_1250[0] = local_1240;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1250,"iswitness","");
  local_1270[0] = local_1260;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1270,"If the address is a witness address.","");
  local_1b38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe29c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar24;
  m_key_name_05._M_string_length = (size_type)in_RDI;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_ffffffffffffe2a8;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffe2b0;
  description_08._M_string_length = in_stack_ffffffffffffe2c0;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_08.field_2 = in_stack_ffffffffffffe2c8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult(&local_b28,BOOL,m_key_name_05,description_08,inner_08,SUB81(local_1250,0));
  local_1290[0] = local_1280;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1290,"witness_version","");
  local_12b0[0] = local_12a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12b0,"The version number of the witness program.","");
  local_1b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar6._4_8_ = in_RDI;
  auVar6._0_4_ = in_stack_ffffffffffffe29c;
  auVar6._12_8_ = in_stack_ffffffffffffe2a8;
  auVar6._20_8_ = in_stack_ffffffffffffe2b0;
  auVar6._28_4_ = 0;
  description_09._M_string_length = in_stack_ffffffffffffe2c0;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_09.field_2 = in_stack_ffffffffffffe2c8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult
            (&local_aa0,NUM,(string)(auVar6 << 0x20),SUB81(local_1290,0),description_09,inner_09,
             true);
  local_12d0[0] = local_12c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_12d0,"witness_program","");
  local_12f0[0] = local_12e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12f0,"The hex value of the witness program.","");
  local_1b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar7._4_8_ = in_RDI;
  auVar7._0_4_ = in_stack_ffffffffffffe29c;
  auVar7._12_8_ = in_stack_ffffffffffffe2a8;
  auVar7._20_8_ = in_stack_ffffffffffffe2b0;
  auVar7._28_4_ = 0;
  description_10._M_string_length = in_stack_ffffffffffffe2c0;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_10.field_2 = in_stack_ffffffffffffe2c8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult
            (&local_a18,STR_HEX,(string)(auVar7 << 0x20),SUB81(local_12d0,0),description_10,inner_10
             ,true);
  local_1310[0] = local_1300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1310,"script","");
  local_1330[0] = local_1320;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1330,
             "The output script type. Only if isscript is true and the redeemscript is known. Possible\ntypes: nonstandard, pubkey, pubkeyhash, scripthash, multisig, nulldata, witness_v0_keyhash,\nwitness_v0_scripthash, witness_unknown."
             ,"");
  local_1b98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar8._4_8_ = in_RDI;
  auVar8._0_4_ = in_stack_ffffffffffffe29c;
  auVar8._12_8_ = in_stack_ffffffffffffe2a8;
  auVar8._20_8_ = in_stack_ffffffffffffe2b0;
  auVar8._28_4_ = 0;
  description_11._M_string_length = in_stack_ffffffffffffe2c0;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_11.field_2 = in_stack_ffffffffffffe2c8;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult
            (&local_990,STR,(string)(auVar8 << 0x20),SUB81(local_1310,0),description_11,inner_11,
             true);
  local_1350[0] = local_1340;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1350,"hex","");
  local_1370[0] = local_1360;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1370,"The redeemscript for the p2sh address.","");
  local_1bb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1bb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1bb8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar24 = 0;
  auVar9._4_8_ = in_RDI;
  auVar9._0_4_ = in_stack_ffffffffffffe29c;
  auVar9._12_8_ = in_stack_ffffffffffffe2a8;
  auVar9._20_8_ = in_stack_ffffffffffffe2b0;
  auVar9._28_4_ = 0;
  description_12._M_string_length = in_stack_ffffffffffffe2c0;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_12.field_2 = in_stack_ffffffffffffe2c8;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult
            (&local_908,STR_HEX,(string)(auVar9 << 0x20),SUB81(local_1350,0),description_12,inner_12
             ,true);
  local_1390[0] = local_1380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1390,"pubkeys","");
  local_13b0[0] = local_13a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13b0,
             "Array of pubkeys associated with the known redeemscript (only if script is multisig)."
             ,"");
  local_1458[0] = local_1448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1458,"pubkey","");
  local_1478[0] = local_1468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1478,"");
  local_1be8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1be8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1be8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe29c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar24;
  m_key_name_06._M_string_length = (size_type)in_RDI;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_ffffffffffffe2a8;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffe2b0;
  description_13._M_string_length = in_stack_ffffffffffffe2c0;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_13.field_2 = in_stack_ffffffffffffe2c8;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult(&local_1438,STR,m_key_name_06,description_13,inner_13,SUB81(local_1458,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_1438;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1bd0,__l_00,&local_1be9);
  auVar10._4_8_ = in_RDI;
  auVar10._0_4_ = in_stack_ffffffffffffe29c;
  auVar10._12_8_ = in_stack_ffffffffffffe2a8;
  auVar10._20_8_ = in_stack_ffffffffffffe2b0;
  auVar10._28_4_ = 0;
  description_14._M_string_length = in_stack_ffffffffffffe2c0;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_14.field_2 = in_stack_ffffffffffffe2c8;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult
            (&local_880,ARR,(string)(auVar10 << 0x20),SUB81(local_1390,0),description_14,inner_14,
             true);
  local_1498[0] = local_1488;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1498,"sigsrequired","");
  local_14b8[0] = local_14a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14b8,
             "The number of signatures required to spend multisig output (only if script is multisig)."
             ,"");
  local_1c08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar11._4_8_ = in_RDI;
  auVar11._0_4_ = in_stack_ffffffffffffe29c;
  auVar11._12_8_ = in_stack_ffffffffffffe2a8;
  auVar11._20_8_ = in_stack_ffffffffffffe2b0;
  auVar11._28_4_ = 0;
  description_15._M_string_length = in_stack_ffffffffffffe2c0;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_15.field_2 = in_stack_ffffffffffffe2c8;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult
            (&local_7f8,NUM,(string)(auVar11 << 0x20),SUB81(local_1498,0),description_15,inner_15,
             true);
  local_14d8[0] = local_14c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_14d8,"pubkey","");
  local_14f8[0] = local_14e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14f8,
             "The hex value of the raw public key for single-key addresses (possibly embedded in P2SH or P2WSH)."
             ,"");
  local_1c28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar24 = 0;
  auVar12._4_8_ = in_RDI;
  auVar12._0_4_ = in_stack_ffffffffffffe29c;
  auVar12._12_8_ = in_stack_ffffffffffffe2a8;
  auVar12._20_8_ = in_stack_ffffffffffffe2b0;
  auVar12._28_4_ = 0;
  description_16._M_string_length = in_stack_ffffffffffffe2c0;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_16.field_2 = in_stack_ffffffffffffe2c8;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult
            (&local_770,STR_HEX,(string)(auVar12 << 0x20),SUB81(local_14d8,0),description_16,
             inner_16,true);
  local_1518[0] = local_1508;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1518,"embedded","");
  local_1538[0] = local_1528;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1538,
             "Information about the address embedded in P2SH or P2WSH, if relevant and known.","");
  local_15e0[0] = local_15d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_15e0,"");
  local_1600[0] = local_15f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1600,
             "Includes all getaddressinfo output fields for the embedded address, excluding metadata (timestamp, hdkeypath, hdseedid)\nand relation to the wallet (ismine, iswatchonly)."
             ,"");
  local_1c58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe29c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar24;
  m_key_name_07._M_string_length = (size_type)in_RDI;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_ffffffffffffe2a8;
  m_key_name_07.field_2._8_8_ = in_stack_ffffffffffffe2b0;
  description_17._M_string_length = in_stack_ffffffffffffe2c0;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_17.field_2 = in_stack_ffffffffffffe2c8;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult
            (&local_15c0,ELISION,m_key_name_07,description_17,inner_17,SUB81(local_15e0,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_15c0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_1c40,__l_01,&local_1c59);
  auVar13._4_8_ = in_RDI;
  auVar13._0_4_ = in_stack_ffffffffffffe29c;
  auVar13._12_8_ = in_stack_ffffffffffffe2a8;
  auVar13._20_8_ = in_stack_ffffffffffffe2b0;
  auVar13._28_4_ = 0;
  description_18._M_string_length = in_stack_ffffffffffffe2c0;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_18.field_2 = in_stack_ffffffffffffe2c8;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult
            (&local_6e8,OBJ,(string)(auVar13 << 0x20),SUB81(local_1518,0),description_18,inner_18,
             true);
  local_1620[0] = local_1610;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1620,"iscompressed","");
  local_1640[0] = local_1630;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1640,"If the pubkey is compressed.","");
  local_1c78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar14._4_8_ = in_RDI;
  auVar14._0_4_ = in_stack_ffffffffffffe29c;
  auVar14._12_8_ = in_stack_ffffffffffffe2a8;
  auVar14._20_8_ = in_stack_ffffffffffffe2b0;
  auVar14._28_4_ = 0;
  description_19._M_string_length = in_stack_ffffffffffffe2c0;
  description_19._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_19.field_2 = in_stack_ffffffffffffe2c8;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult
            (&local_660,BOOL,(string)(auVar14 << 0x20),SUB81(local_1620,0),description_19,inner_19,
             true);
  local_1660[0] = local_1650;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1660,"timestamp","");
  std::operator+(&local_16a0,"The creation time of the key, if available, expressed in ",
                 &UNIX_EPOCH_TIME_abi_cxx11_);
  pbVar19 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_16a0,".");
  local_1680 = &local_1670;
  psVar1 = (size_type *)(pbVar19->_M_dataplus)._M_p;
  paVar20 = &pbVar19->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar20) {
    local_1670 = paVar20->_M_allocated_capacity;
    uStack_1668 = *(undefined8 *)((long)&pbVar19->field_2 + 8);
  }
  else {
    local_1670 = paVar20->_M_allocated_capacity;
    local_1680 = psVar1;
  }
  local_1678 = pbVar19->_M_string_length;
  (pbVar19->_M_dataplus)._M_p = (pointer)paVar20;
  pbVar19->_M_string_length = 0;
  (pbVar19->field_2)._M_local_buf[0] = '\0';
  auVar15._4_8_ = in_RDI;
  auVar15._0_4_ = in_stack_ffffffffffffe29c;
  auVar15._12_8_ = in_stack_ffffffffffffe2a8;
  auVar15._20_8_ = in_stack_ffffffffffffe2b0;
  auVar15._28_4_ = 0;
  description_20._M_string_length = in_stack_ffffffffffffe2c0;
  description_20._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_20.field_2 = in_stack_ffffffffffffe2c8;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult
            (&local_5d8,NUM_TIME,(string)(auVar15 << 0x20),SUB81(local_1660,0),description_20,
             inner_20,true);
  local_16c0[0] = local_16b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_16c0,"hdkeypath","");
  local_16e0[0] = local_16d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16e0,"The HD keypath, if the key is HD and available.","");
  auVar16._4_8_ = in_RDI;
  auVar16._0_4_ = in_stack_ffffffffffffe29c;
  auVar16._12_8_ = in_stack_ffffffffffffe2a8;
  auVar16._20_8_ = in_stack_ffffffffffffe2b0;
  auVar16._28_4_ = 0;
  description_21._M_string_length = in_stack_ffffffffffffe2c0;
  description_21._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_21.field_2 = in_stack_ffffffffffffe2c8;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult
            (&local_550,STR,(string)(auVar16 << 0x20),SUB81(local_16c0,0),description_21,inner_21,
             true);
  local_1700[0] = local_16f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1700,"hdseedid","");
  local_1720[0] = local_1710;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1720,"The Hash160 of the HD seed.","");
  auVar17._4_8_ = in_RDI;
  auVar17._0_4_ = in_stack_ffffffffffffe29c;
  auVar17._12_8_ = in_stack_ffffffffffffe2a8;
  auVar17._20_8_ = in_stack_ffffffffffffe2b0;
  auVar17._28_4_ = 0;
  description_22._M_string_length = in_stack_ffffffffffffe2c0;
  description_22._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_22.field_2 = in_stack_ffffffffffffe2c8;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult
            (&local_4c8,STR_HEX,(string)(auVar17 << 0x20),false,description_22,inner_22,true);
  local_1740[0] = local_1730;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1740,"hdmasterfingerprint","");
  local_1760[0] = local_1750;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1760,"The fingerprint of the master key.","");
  pRVar29 = (pointer)0x0;
  pRVar30 = (pointer)0x0;
  pRVar31 = (pointer)0x0;
  uVar24 = 0;
  auVar18._4_8_ = in_RDI;
  auVar18._0_4_ = in_stack_ffffffffffffe29c;
  auVar18._12_8_ = in_stack_ffffffffffffe2a8;
  auVar18._20_8_ = in_stack_ffffffffffffe2b0;
  auVar18._28_4_ = 0;
  description_23._M_string_length = in_stack_ffffffffffffe2c0;
  description_23._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_23.field_2 = in_stack_ffffffffffffe2c8;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe2e0;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffe2d8;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe2e8;
  ::RPCResult::RPCResult
            (&local_440,STR_HEX,(string)(auVar18 << 0x20),SUB81(local_1740,0),description_23,
             inner_23,true);
  local_1780[0] = local_1770;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1780,"labels","");
  local_17a0[0] = local_1790;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17a0,
             "Array of labels associated with the address. Currently limited to one label but returned\nas an array to keep the API stable if multiple labels are enabled in the future."
             ,"");
  local_1848[0] = local_1838;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1848,"label name","");
  local_1868[0] = local_1858;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1868,"Label name (defaults to \"\").","");
  pRVar26 = (pointer)0x0;
  pRVar27 = (pointer)0x0;
  pRVar28 = (pointer)0x0;
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe29c;
  m_key_name_08._M_dataplus._M_p._0_4_ = uVar24;
  m_key_name_08._M_string_length = (size_type)in_RDI;
  m_key_name_08.field_2._M_allocated_capacity = in_stack_ffffffffffffe2a8;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffe2b0;
  description_24._M_string_length = in_stack_ffffffffffffe2c0;
  description_24._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_24.field_2 = in_stack_ffffffffffffe2c8;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  ::RPCResult::RPCResult(&local_1828,STR,m_key_name_08,description_24,inner_24,SUB81(local_1848,0));
  __l_02._M_len = 1;
  __l_02._M_array = &local_1828;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe2f0,__l_02,
             (allocator_type *)&stack0xffffffffffffe2d7);
  m_key_name_09._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe29c;
  m_key_name_09._M_dataplus._M_p._0_4_ = uVar24;
  m_key_name_09._M_string_length = (size_type)in_RDI;
  m_key_name_09.field_2._M_allocated_capacity = in_stack_ffffffffffffe2a8;
  m_key_name_09.field_2._8_8_ = in_stack_ffffffffffffe2b0;
  description_25._M_string_length = in_stack_ffffffffffffe2c0;
  description_25._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_25.field_2._M_local_buf = in_stack_ffffffffffffe2c8._M_local_buf;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar27;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar26;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar28;
  ::RPCResult::RPCResult(&local_3b8,ARR,m_key_name_09,description_25,inner_25,SUB81(local_1780,0));
  __l_03._M_len = 0x18;
  __l_03._M_array = (iterator)(local_1000 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_19f8,__l_03,(allocator_type *)&stack0xffffffffffffe2d6);
  m_key_name_10._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffe29c;
  m_key_name_10._M_dataplus._M_p._0_4_ = uVar24;
  m_key_name_10._M_string_length = (size_type)in_RDI;
  m_key_name_10.field_2._M_allocated_capacity = in_stack_ffffffffffffe2a8;
  m_key_name_10.field_2._8_8_ = in_stack_ffffffffffffe2b0;
  description_26._M_string_length = in_stack_ffffffffffffe2c0;
  description_26._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe2b8;
  description_26.field_2 = in_stack_ffffffffffffe2c8;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar27;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar26;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar28;
  ::RPCResult::RPCResult(&local_2f0,OBJ,m_key_name_10,description_26,inner_26,SUB81(local_310,0));
  result._4_4_ = in_stack_ffffffffffffe29c;
  result.m_type = uVar24;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_ffffffffffffe2a8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffe2b0;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffe2b8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffe2c0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_ffffffffffffe2c8;
  result._64_8_ = pRVar26;
  result.m_description._M_dataplus._M_p = (pointer)pRVar27;
  result.m_description._M_string_length = (size_type)pRVar28;
  result._88_24_ = in_stack_ffffffffffffe2f0;
  result.m_cond._M_string_length = (size_type)pRVar29;
  result.m_cond.field_2._M_allocated_capacity = (size_type)pRVar30;
  result.m_cond.field_2._8_8_ = pRVar31;
  RPCResults::RPCResults(&local_19e0,result);
  local_18e8._M_dataplus._M_p = (pointer)&local_18e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_18e8,"getaddressinfo","");
  std::operator+(&local_1928,"\"",EXAMPLE_ADDRESS_abi_cxx11_);
  pbVar19 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_1928,"\"");
  local_1908._M_dataplus._M_p = (pbVar19->_M_dataplus)._M_p;
  paVar20 = &pbVar19->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1908._M_dataplus._M_p == paVar20) {
    local_1908.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
    local_1908.field_2._8_8_ = *(undefined8 *)((long)&pbVar19->field_2 + 8);
    local_1908._M_dataplus._M_p = (pointer)&local_1908.field_2;
  }
  else {
    local_1908.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
  }
  local_1908._M_string_length = pbVar19->_M_string_length;
  (pbVar19->_M_dataplus)._M_p = (pointer)paVar20;
  pbVar19->_M_string_length = 0;
  (pbVar19->field_2)._M_local_buf[0] = '\0';
  HelpExampleCli(&local_18c8,&local_18e8,&local_1908);
  local_1968._M_dataplus._M_p = (pointer)&local_1968.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1968,"getaddressinfo","");
  std::operator+(&local_19a8,"\"",EXAMPLE_ADDRESS_abi_cxx11_);
  pbVar19 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_19a8,"\"");
  local_1988._M_dataplus._M_p = (pointer)&local_1988.field_2;
  paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar19->_M_dataplus)._M_p;
  paVar21 = &pbVar19->field_2;
  if (paVar20 == paVar21) {
    local_1988.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
    local_1988.field_2._8_8_ = *(undefined8 *)((long)&pbVar19->field_2 + 8);
  }
  else {
    local_1988.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
    local_1988._M_dataplus._M_p = (pointer)paVar20;
  }
  local_1988._M_string_length = pbVar19->_M_string_length;
  (pbVar19->_M_dataplus)._M_p = (pointer)paVar21;
  pbVar19->_M_string_length = 0;
  (pbVar19->field_2)._M_local_buf[0] = '\0';
  HelpExampleRpc(&local_1948,&local_1968,&local_1988);
  uVar22 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18c8._M_dataplus._M_p != &local_18c8.field_2) {
    uVar22 = local_18c8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar22 < local_1948._M_string_length + local_18c8._M_string_length) {
    uVar22 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1948._M_dataplus._M_p != &local_1948.field_2) {
      uVar22 = local_1948.field_2._M_allocated_capacity;
    }
    if (local_1948._M_string_length + local_18c8._M_string_length <= (ulong)uVar22) {
      pbVar19 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace(&local_1948,0,0,local_18c8._M_dataplus._M_p,local_18c8._M_string_length);
      goto LAB_00ca4746;
    }
  }
  pbVar19 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_18c8,local_1948._M_dataplus._M_p,local_1948._M_string_length);
LAB_00ca4746:
  local_18a8 = &local_1898;
  puVar2 = (ulong *)(pbVar19->_M_dataplus)._M_p;
  paVar20 = &pbVar19->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar20) {
    local_1898 = paVar20->_M_allocated_capacity;
    uStack_1890 = *(undefined8 *)((long)&pbVar19->field_2 + 8);
  }
  else {
    local_1898 = paVar20->_M_allocated_capacity;
    local_18a8 = puVar2;
  }
  local_1880 = pbVar19->_M_string_length;
  (pbVar19->_M_dataplus)._M_p = (pointer)paVar20;
  pbVar19->_M_string_length = 0;
  paVar20->_M_local_buf[0] = '\0';
  if (local_18a8 == &local_1898) {
    uStack_1870 = uStack_1890;
    local_1888 = &local_1878;
  }
  else {
    local_1888 = local_18a8;
  }
  local_1878 = local_1898;
  local_18a0 = 0;
  local_1898 = local_1898 & 0xffffffffffffff00;
  pcVar25 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/addresses.cpp:574:9)>
            ::_M_manager;
  description_27._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/addresses.cpp:574:9)>
       ::_M_invoke;
  description_27._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/addresses.cpp:574:9)>
                ::_M_manager;
  description_27.field_2 = in_stack_ffffffffffffe2c8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar27;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar26;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar28;
  examples.m_examples._M_string_length = (size_type)pRVar30;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar29;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar31;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffe320;
  local_18a8 = &local_1898;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xffffffffffffe2a8)),description_27,args,
             (RPCResults)in_stack_ffffffffffffe2f0,examples,(RPCMethodImpl *)&local_58);
  if (pcVar25 != (code *)0x0) {
    (*pcVar25)(&stack0xffffffffffffe2a8,&stack0xffffffffffffe2a8,3);
  }
  if (local_1888 != &local_1878) {
    operator_delete(local_1888,local_1878 + 1);
  }
  if (local_18a8 != &local_1898) {
    operator_delete(local_18a8,local_1898 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1948._M_dataplus._M_p != &local_1948.field_2) {
    operator_delete(local_1948._M_dataplus._M_p,local_1948.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1988._M_dataplus._M_p != &local_1988.field_2) {
    operator_delete(local_1988._M_dataplus._M_p,local_1988.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_19a8._M_dataplus._M_p != &local_19a8.field_2) {
    operator_delete(local_19a8._M_dataplus._M_p,local_19a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1968._M_dataplus._M_p != &local_1968.field_2) {
    operator_delete(local_1968._M_dataplus._M_p,local_1968.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18c8._M_dataplus._M_p != &local_18c8.field_2) {
    operator_delete(local_18c8._M_dataplus._M_p,local_18c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1908._M_dataplus._M_p != &local_1908.field_2) {
    operator_delete(local_1908._M_dataplus._M_p,local_1908.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1928._M_dataplus._M_p != &local_1928.field_2) {
    operator_delete(local_1928._M_dataplus._M_p,local_1928.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18e8._M_dataplus._M_p != &local_18e8.field_2) {
    operator_delete(local_18e8._M_dataplus._M_p,local_18e8.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_19e0.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_cond._M_dataplus._M_p != &local_2f0.m_cond.field_2) {
    operator_delete(local_2f0.m_cond._M_dataplus._M_p,
                    local_2f0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_description._M_dataplus._M_p != &local_2f0.m_description.field_2) {
    operator_delete(local_2f0.m_description._M_dataplus._M_p,
                    local_2f0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2f0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_key_name._M_dataplus._M_p != &local_2f0.m_key_name.field_2) {
    operator_delete(local_2f0.m_key_name._M_dataplus._M_p,
                    local_2f0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_19f8);
  lVar23 = 0xcc0;
  do {
    if ((long *)(local_1000 + lVar23) != *(long **)((long)local_1010 + lVar23)) {
      operator_delete(*(long **)((long)local_1010 + lVar23),*(long *)(local_1000 + lVar23) + 1);
    }
    if ((long *)((long)local_1020 + lVar23) != *(long **)((long)local_1030 + lVar23)) {
      operator_delete(*(long **)((long)local_1030 + lVar23),*(long *)((long)local_1020 + lVar23) + 1
                     );
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_1050.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar23));
    if ((long *)((long)local_1060 + lVar23) != *(long **)((long)local_1070 + lVar23)) {
      operator_delete(*(long **)((long)local_1070 + lVar23),*(long *)((long)local_1060 + lVar23) + 1
                     );
    }
    lVar23 = lVar23 + -0x88;
  } while (lVar23 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1828.m_cond._M_dataplus._M_p != &local_1828.m_cond.field_2) {
    operator_delete(local_1828.m_cond._M_dataplus._M_p,
                    local_1828.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1828.m_description._M_dataplus._M_p != &local_1828.m_description.field_2) {
    operator_delete(local_1828.m_description._M_dataplus._M_p,
                    local_1828.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1828.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1828.m_key_name._M_dataplus._M_p != &local_1828.m_key_name.field_2) {
    operator_delete(local_1828.m_key_name._M_dataplus._M_p,
                    local_1828.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe2d8);
  if (local_1868[0] != local_1858) {
    operator_delete(local_1868[0],local_1858[0] + 1);
  }
  if (local_1848[0] != local_1838) {
    operator_delete(local_1848[0],local_1838[0] + 1);
  }
  if (local_17a0[0] != local_1790) {
    operator_delete(local_17a0[0],local_1790[0] + 1);
  }
  if (local_1780[0] != local_1770) {
    operator_delete(local_1780[0],local_1770[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe308);
  if (local_1760[0] != local_1750) {
    operator_delete(local_1760[0],local_1750[0] + 1);
  }
  if (local_1740[0] != local_1730) {
    operator_delete(local_1740[0],local_1730[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe328);
  if (local_1720[0] != local_1710) {
    operator_delete(local_1720[0],local_1710[0] + 1);
  }
  if (local_1700[0] != local_16f0) {
    operator_delete(local_1700[0],local_16f0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe348);
  if (local_16e0[0] != local_16d0) {
    operator_delete(local_16e0[0],local_16d0[0] + 1);
  }
  if (local_16c0[0] != local_16b0) {
    operator_delete(local_16c0[0],local_16b0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe368);
  if (local_1680 != &local_1670) {
    operator_delete(local_1680,local_1670 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16a0._M_dataplus._M_p != &local_16a0.field_2) {
    operator_delete(local_16a0._M_dataplus._M_p,local_16a0.field_2._M_allocated_capacity + 1);
  }
  if (local_1660[0] != local_1650) {
    operator_delete(local_1660[0],local_1650[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1c78);
  if (local_1640[0] != local_1630) {
    operator_delete(local_1640[0],local_1630[0] + 1);
  }
  if (local_1620[0] != local_1610) {
    operator_delete(local_1620[0],local_1610[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1c40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15c0.m_cond._M_dataplus._M_p != &local_15c0.m_cond.field_2) {
    operator_delete(local_15c0.m_cond._M_dataplus._M_p,
                    local_15c0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15c0.m_description._M_dataplus._M_p != &local_15c0.m_description.field_2) {
    operator_delete(local_15c0.m_description._M_dataplus._M_p,
                    local_15c0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15c0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15c0.m_key_name._M_dataplus._M_p != &local_15c0.m_key_name.field_2) {
    operator_delete(local_15c0.m_key_name._M_dataplus._M_p,
                    local_15c0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1c58);
  if (local_1600[0] != local_15f0) {
    operator_delete(local_1600[0],local_15f0[0] + 1);
  }
  if (local_15e0[0] != local_15d0) {
    operator_delete(local_15e0[0],local_15d0[0] + 1);
  }
  if (local_1538[0] != local_1528) {
    operator_delete(local_1538[0],local_1528[0] + 1);
  }
  if (local_1518[0] != local_1508) {
    operator_delete(local_1518[0],local_1508[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1c28);
  if (local_14f8[0] != local_14e8) {
    operator_delete(local_14f8[0],local_14e8[0] + 1);
  }
  if (local_14d8[0] != local_14c8) {
    operator_delete(local_14d8[0],local_14c8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1c08);
  if (local_14b8[0] != local_14a8) {
    operator_delete(local_14b8[0],local_14a8[0] + 1);
  }
  if (local_1498[0] != local_1488) {
    operator_delete(local_1498[0],local_1488[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1bd0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1438.m_cond._M_dataplus._M_p != &local_1438.m_cond.field_2) {
    operator_delete(local_1438.m_cond._M_dataplus._M_p,
                    local_1438.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1438.m_description._M_dataplus._M_p != &local_1438.m_description.field_2) {
    operator_delete(local_1438.m_description._M_dataplus._M_p,
                    local_1438.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1438.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1438.m_key_name._M_dataplus._M_p != &local_1438.m_key_name.field_2) {
    operator_delete(local_1438.m_key_name._M_dataplus._M_p,
                    local_1438.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1be8);
  if (local_1478[0] != local_1468) {
    operator_delete(local_1478[0],local_1468[0] + 1);
  }
  if (local_1458[0] != local_1448) {
    operator_delete(local_1458[0],local_1448[0] + 1);
  }
  if (local_13b0[0] != local_13a0) {
    operator_delete(local_13b0[0],local_13a0[0] + 1);
  }
  if (local_1390[0] != local_1380) {
    operator_delete(local_1390[0],local_1380[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1bb8);
  if (local_1370[0] != local_1360) {
    operator_delete(local_1370[0],local_1360[0] + 1);
  }
  if (local_1350[0] != local_1340) {
    operator_delete(local_1350[0],local_1340[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b98);
  if (local_1330[0] != local_1320) {
    operator_delete(local_1330[0],local_1320[0] + 1);
  }
  if (local_1310[0] != local_1300) {
    operator_delete(local_1310[0],local_1300[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b78);
  if (local_12f0[0] != local_12e0) {
    operator_delete(local_12f0[0],local_12e0[0] + 1);
  }
  if (local_12d0[0] != local_12c0) {
    operator_delete(local_12d0[0],local_12c0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b58);
  if (local_12b0[0] != local_12a0) {
    operator_delete(local_12b0[0],local_12a0[0] + 1);
  }
  if (local_1290[0] != local_1280) {
    operator_delete(local_1290[0],local_1280[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b38);
  if (local_1270[0] != local_1260) {
    operator_delete(local_1270[0],local_1260[0] + 1);
  }
  if (local_1250[0] != local_1240) {
    operator_delete(local_1250[0],local_1240[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1b18);
  if (local_1230[0] != local_1220) {
    operator_delete(local_1230[0],local_1220[0] + 1);
  }
  if (local_1210[0] != local_1200) {
    operator_delete(local_1210[0],local_1200[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1af8);
  if (local_11f0[0] != local_11e0) {
    operator_delete(local_11f0[0],local_11e0[0] + 1);
  }
  if (local_11d0[0] != local_11c0) {
    operator_delete(local_11d0[0],local_11c0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1ad8);
  if (local_11b0[0] != local_11a0) {
    operator_delete(local_11b0[0],local_11a0[0] + 1);
  }
  if (local_1190[0] != local_1180) {
    operator_delete(local_1190[0],local_1180[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1ab8);
  if (local_1170[0] != local_1160) {
    operator_delete(local_1170[0],local_1160[0] + 1);
  }
  if (local_1150[0] != local_1140) {
    operator_delete(local_1150[0],local_1140[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a98);
  if (local_1130[0] != local_1120) {
    operator_delete(local_1130[0],local_1120[0] + 1);
  }
  if (local_1110[0] != local_1100) {
    operator_delete(local_1110[0],local_1100[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a78);
  if (local_10f0[0] != local_10e0) {
    operator_delete(local_10f0[0],local_10e0[0] + 1);
  }
  if (local_10d0[0] != local_10c0) {
    operator_delete(local_10d0[0],local_10c0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a58);
  if (local_10b0[0] != local_10a0) {
    operator_delete(local_10b0[0],local_10a0[0] + 1);
  }
  if (local_1090[0] != local_1080) {
    operator_delete(local_1090[0],local_1080[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a38);
  if (local_1070[0] != local_1060) {
    operator_delete(local_1070[0],local_1060[0] + 1);
  }
  if (local_1050.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1050.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_1050.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_1050.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1a18);
  if (local_1030[0] != local_1020) {
    operator_delete(local_1030[0],local_1020[0] + 1);
  }
  if (local_1010[0] != (pointer)local_1000) {
    operator_delete(local_1010[0],local_1000._0_8_ + 1);
  }
  if (local_330[0] != local_320) {
    operator_delete(local_330[0],local_320[0] + 1);
  }
  if (local_310[0] != local_300) {
    operator_delete(local_310[0],local_300[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_19c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_opts.oneline_description._M_dataplus._M_p !=
      &local_180.m_opts.oneline_description.field_2) {
    operator_delete(local_180.m_opts.oneline_description._M_dataplus._M_p,
                    local_180.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_description._M_dataplus._M_p != &local_180.m_description.field_2) {
    operator_delete(local_180.m_description._M_dataplus._M_p,
                    local_180.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_180.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_180.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_names._M_dataplus._M_p != &local_180.m_names.field_2) {
    operator_delete(local_180.m_names._M_dataplus._M_p,
                    local_180.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_240);
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
  }
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_200._M_first);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan getaddressinfo()
{
    return RPCHelpMan{"getaddressinfo",
                "\nReturn information about the given bitcoin address.\n"
                "Some of the information will only be present if the address is in the active wallet.\n",
                {
                    {"address", RPCArg::Type::STR, RPCArg::Optional::NO, "The bitcoin address for which to get information."},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR, "address", "The bitcoin address validated."},
                        {RPCResult::Type::STR_HEX, "scriptPubKey", "The hex-encoded output script generated by the address."},
                        {RPCResult::Type::BOOL, "ismine", "If the address is yours."},
                        {RPCResult::Type::BOOL, "iswatchonly", "If the address is watchonly."},
                        {RPCResult::Type::BOOL, "solvable", "If we know how to spend coins sent to this address, ignoring the possible lack of private keys."},
                        {RPCResult::Type::STR, "desc", /*optional=*/true, "A descriptor for spending coins sent to this address (only when solvable)."},
                        {RPCResult::Type::STR, "parent_desc", /*optional=*/true, "The descriptor used to derive this address if this is a descriptor wallet"},
                        {RPCResult::Type::BOOL, "isscript", /*optional=*/true, "If the key is a script."},
                        {RPCResult::Type::BOOL, "ischange", "If the address was used for change output."},
                        {RPCResult::Type::BOOL, "iswitness", "If the address is a witness address."},
                        {RPCResult::Type::NUM, "witness_version", /*optional=*/true, "The version number of the witness program."},
                        {RPCResult::Type::STR_HEX, "witness_program", /*optional=*/true, "The hex value of the witness program."},
                        {RPCResult::Type::STR, "script", /*optional=*/true, "The output script type. Only if isscript is true and the redeemscript is known. Possible\n"
                                                                     "types: nonstandard, pubkey, pubkeyhash, scripthash, multisig, nulldata, witness_v0_keyhash,\n"
                            "witness_v0_scripthash, witness_unknown."},
                        {RPCResult::Type::STR_HEX, "hex", /*optional=*/true, "The redeemscript for the p2sh address."},
                        {RPCResult::Type::ARR, "pubkeys", /*optional=*/true, "Array of pubkeys associated with the known redeemscript (only if script is multisig).",
                        {
                            {RPCResult::Type::STR, "pubkey", ""},
                        }},
                        {RPCResult::Type::NUM, "sigsrequired", /*optional=*/true, "The number of signatures required to spend multisig output (only if script is multisig)."},
                        {RPCResult::Type::STR_HEX, "pubkey", /*optional=*/true, "The hex value of the raw public key for single-key addresses (possibly embedded in P2SH or P2WSH)."},
                        {RPCResult::Type::OBJ, "embedded", /*optional=*/true, "Information about the address embedded in P2SH or P2WSH, if relevant and known.",
                        {
                            {RPCResult::Type::ELISION, "", "Includes all getaddressinfo output fields for the embedded address, excluding metadata (timestamp, hdkeypath, hdseedid)\n"
                            "and relation to the wallet (ismine, iswatchonly)."},
                        }},
                        {RPCResult::Type::BOOL, "iscompressed", /*optional=*/true, "If the pubkey is compressed."},
                        {RPCResult::Type::NUM_TIME, "timestamp", /*optional=*/true, "The creation time of the key, if available, expressed in " + UNIX_EPOCH_TIME + "."},
                        {RPCResult::Type::STR, "hdkeypath", /*optional=*/true, "The HD keypath, if the key is HD and available."},
                        {RPCResult::Type::STR_HEX, "hdseedid", /*optional=*/true, "The Hash160 of the HD seed."},
                        {RPCResult::Type::STR_HEX, "hdmasterfingerprint", /*optional=*/true, "The fingerprint of the master key."},
                        {RPCResult::Type::ARR, "labels", "Array of labels associated with the address. Currently limited to one label but returned\n"
                            "as an array to keep the API stable if multiple labels are enabled in the future.",
                        {
                            {RPCResult::Type::STR, "label name", "Label name (defaults to \"\")."},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("getaddressinfo", "\"" + EXAMPLE_ADDRESS[0] + "\"") +
                    HelpExampleRpc("getaddressinfo", "\"" + EXAMPLE_ADDRESS[0] + "\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    LOCK(pwallet->cs_wallet);

    std::string error_msg;
    CTxDestination dest = DecodeDestination(request.params[0].get_str(), error_msg);

    // Make sure the destination is valid
    if (!IsValidDestination(dest)) {
        // Set generic error message in case 'DecodeDestination' didn't set it
        if (error_msg.empty()) error_msg = "Invalid address";

        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, error_msg);
    }

    UniValue ret(UniValue::VOBJ);

    std::string currentAddress = EncodeDestination(dest);
    ret.pushKV("address", currentAddress);

    CScript scriptPubKey = GetScriptForDestination(dest);
    ret.pushKV("scriptPubKey", HexStr(scriptPubKey));

    std::unique_ptr<SigningProvider> provider = pwallet->GetSolvingProvider(scriptPubKey);

    isminetype mine = pwallet->IsMine(dest);
    ret.pushKV("ismine", bool(mine & ISMINE_SPENDABLE));

    if (provider) {
        auto inferred = InferDescriptor(scriptPubKey, *provider);
        bool solvable = inferred->IsSolvable();
        ret.pushKV("solvable", solvable);
        if (solvable) {
            ret.pushKV("desc", inferred->ToString());
        }
    } else {
        ret.pushKV("solvable", false);
    }

    const auto& spk_mans = pwallet->GetScriptPubKeyMans(scriptPubKey);
    // In most cases there is only one matching ScriptPubKey manager and we can't resolve ambiguity in a better way
    ScriptPubKeyMan* spk_man{nullptr};
    if (spk_mans.size()) spk_man = *spk_mans.begin();

    DescriptorScriptPubKeyMan* desc_spk_man = dynamic_cast<DescriptorScriptPubKeyMan*>(spk_man);
    if (desc_spk_man) {
        std::string desc_str;
        if (desc_spk_man->GetDescriptorString(desc_str, /*priv=*/false)) {
            ret.pushKV("parent_desc", desc_str);
        }
    }

    ret.pushKV("iswatchonly", bool(mine & ISMINE_WATCH_ONLY));

    UniValue detail = DescribeWalletAddress(*pwallet, dest);
    ret.pushKVs(std::move(detail));

    ret.pushKV("ischange", ScriptIsChange(*pwallet, scriptPubKey));

    if (spk_man) {
        if (const std::unique_ptr<CKeyMetadata> meta = spk_man->GetMetadata(dest)) {
            ret.pushKV("timestamp", meta->nCreateTime);
            if (meta->has_key_origin) {
                // In legacy wallets hdkeypath has always used an apostrophe for
                // hardened derivation. Perhaps some external tool depends on that.
                ret.pushKV("hdkeypath", WriteHDKeypath(meta->key_origin.path, /*apostrophe=*/!desc_spk_man));
                ret.pushKV("hdseedid", meta->hd_seed_id.GetHex());
                ret.pushKV("hdmasterfingerprint", HexStr(meta->key_origin.fingerprint));
            }
        }
    }

    // Return a `labels` array containing the label associated with the address,
    // equivalent to the `label` field above. Currently only one label can be
    // associated with an address, but we return an array so the API remains
    // stable if we allow multiple labels to be associated with an address in
    // the future.
    UniValue labels(UniValue::VARR);
    const auto* address_book_entry = pwallet->FindAddressBookEntry(dest);
    if (address_book_entry) {
        labels.push_back(address_book_entry->GetLabel());
    }
    ret.pushKV("labels", std::move(labels));

    return ret;
},
    };
}